

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals Omega_h::repeat_symm<3>(LO n,Tensor<3> symm)

{
  Vector<6> v;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  v.super_Few<double,_6>.array_[1] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1];
  v.super_Few<double,_6>.array_[0] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
  v.super_Few<double,_6>.array_[2] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
  v.super_Few<double,_6>.array_[3] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0];
  v.super_Few<double,_6>.array_[4] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1];
  v.super_Few<double,_6>.array_[5] =
       symm.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0];
  RVar1 = repeat_vector<6>(n,v);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}